

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O3

bool __thiscall protozero::pbf_reader::get_bool(pbf_reader *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 *puVar4;
  assert_error *this_00;
  char *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  long lVar7;
  
  if (this->m_tag == 0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"tag() != 0 && \"call next() before accessing field value\"")
    ;
  }
  else {
    if (this->m_wire_type == varint) {
      pcVar2 = this->m_data;
      pcVar3 = this->m_end;
      if (pcVar2 != pcVar3) {
        cVar1 = *pcVar2;
        lVar7 = 0;
        pcVar5 = pcVar2;
        do {
          if (-1 < *pcVar5) {
            if (lVar7 < 10) {
              this->m_data = pcVar5 + 1;
              return cVar1 != '\0';
            }
            goto LAB_0016af93;
          }
          pcVar5 = pcVar5 + 1;
          lVar7 = lVar7 + 1;
        } while (pcVar5 != pcVar3);
      }
      if ((long)pcVar3 - (long)pcVar2 < 10) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PTR__exception_002571d0;
        ppuVar6 = &end_of_buffer_exception::typeinfo;
      }
      else {
LAB_0016af93:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PTR__exception_002571a8;
        ppuVar6 = &varint_too_long_exception::typeinfo;
      }
      __cxa_throw(puVar4,ppuVar6,std::exception::~exception);
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"has_wire_type(pbf_wire_type::varint) && \"not a varint\"");
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool get_bool() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        protozero_assert(has_wire_type(pbf_wire_type::varint) && "not a varint");
        const bool result = m_data[0] != 0;
        skip_varint(&m_data, m_end);
        return result;
    }